

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O0

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
::settle(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
         *this)

{
  bool bVar1;
  iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *piVar2;
  reference piVar3;
  reference piVar4;
  reference piVar5;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_28;
  outer_range_iterator range;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  local_18;
  __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
  max_range;
  intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>,_std::less<void>_>
  *this_local;
  
  max_range._M_current = (iterator_range<const_int_*> *)this;
  bVar1 = __gnu_cxx::operator!=(&this->m_begin,&this->m_end);
  if (bVar1) {
    range._M_current = (this->m_end)._M_current;
    local_18 = std::
               prev<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>
                         ((__normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                           )range._M_current,1);
    local_28._M_current = (this->m_begin)._M_current;
    while (bVar1 = __gnu_cxx::operator!=(&local_28,&local_18), bVar1) {
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&local_28);
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&local_18);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
              less<void>::operator()(&this->field_0x10,piVar3,piVar4);
      if (bVar1) {
        piVar5 = __gnu_cxx::
                 __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                 ::operator*(&local_28);
        piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
                 __gnu_cxx::
                 __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                 ::operator->(&local_18);
        piVar3 = boost::iterator_range_detail::
                 iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
                 front(piVar2);
        skip_to_lower_bound<boost::iterator_range<int_const*>,int,std::less<void>>(piVar5,piVar3);
        piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
                 __gnu_cxx::
                 __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
                 ::operator->(&local_28);
        bVar1 = boost::iterator_range_detail::
                iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
                empty(piVar2);
        if (bVar1) {
          scroll_to_end(this);
          return;
        }
      }
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&local_18);
      piVar3 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      piVar2 = (iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag> *)
               __gnu_cxx::
               __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
               ::operator->(&local_28);
      piVar4 = boost::iterator_range_detail::
               iterator_range_base<const_int_*,_boost::iterators::incrementable_traversal_tag>::
               front(piVar2);
      bVar1 = (((std::forward<int_const&>)({parm#1}))<((std::forward<int_const&>)({parm#2})))std::
              less<void>::operator()(&this->field_0x10,piVar3,piVar4);
      if (bVar1) {
        std::
        iter_swap<__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>,__gnu_cxx::__normal_iterator<boost::iterator_range<int_const*>*,std::vector<boost::iterator_range<int_const*>,std::allocator<boost::iterator_range<int_const*>>>>>
                  (local_18,local_28);
        local_28._M_current = (this->m_begin)._M_current;
      }
      else {
        __gnu_cxx::
        __normal_iterator<boost::iterator_range<const_int_*>_*,_std::vector<boost::iterator_range<const_int_*>,_std::allocator<boost::iterator_range<const_int_*>_>_>_>
        ::operator++(&local_28);
      }
    }
  }
  return;
}

Assistant:

void settle ()
        {
            if (m_begin != m_end)
            {
                const auto max_range = std::prev(m_end);

                auto range = m_begin;
                while (range != max_range)
                {
                    if (m_compare(range->front(), max_range->front()))
                    {
                        skip_to_lower_bound(*range, max_range->front(), m_compare);
                        if (range->empty())
                        {
                            scroll_to_end();
                            return;
                        }
                    }

                    if (m_compare(max_range->front(), range->front()))
                    {
                        // Возможно, тут надо продвинуть последний диапазон до нового минимума и
                        // посмотреть, нужно ли его после этого менять местами с текущим
                        // диапазоном. Возможно, это будет цикл.
                        std::iter_swap(max_range, range);
                        range = m_begin;
                    }
                    else
                    {
                        ++range;
                    }
                }
            }
        }